

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O0

void __thiscall amrex::FabArrayBase::FB::define_os(FB *this,FabArrayBase *fa)

{
  int iVar1;
  Long LVar2;
  FabArrayBase *in_RSI;
  undefined1 *in_RDI;
  int i;
  int nlocal;
  Vector<int,_std::allocator<int>_> *imap;
  DistributionMapping *dm;
  BoxArray *ba;
  undefined1 in_stack_0000043f;
  DistributionMapping *in_stack_00000440;
  BoxArray *in_stack_00000448;
  int in_stack_00000454;
  FB *in_stack_00000458;
  int iVar3;
  
  *in_RDI = 1;
  in_RDI[1] = 1;
  boxArray(in_RSI);
  DistributionMap(in_RSI);
  IndexArray(in_RSI);
  LVar2 = Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0x1004e15);
  iVar1 = (int)LVar2;
  for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
    Vector<int,_std::allocator<int>_>::operator[]
              ((Vector<int,_std::allocator<int>_> *)CONCAT44(iVar1,iVar3),(size_type)in_RDI);
    tag_one_box(in_stack_00000458,in_stack_00000454,in_stack_00000448,in_stack_00000440,
                (bool)in_stack_0000043f);
  }
  return;
}

Assistant:

void
FabArrayBase::FB::define_os (const FabArrayBase& fa)
{
    m_threadsafe_loc = true;
    m_threadsafe_rcv = true;

    const BoxArray&            ba       = fa.boxArray();
    const DistributionMapping& dm       = fa.DistributionMap();
    const Vector<int>&         imap     = fa.IndexArray();
    const int nlocal = imap.size();

    for (int i = 0; i < nlocal; ++i)
    {
        tag_one_box(imap[i], ba, dm, true);
    }

#ifdef AMREX_USE_MPI
    if (ParallelDescriptor::NProcs() > 1) {
        const std::vector<IntVect>& pshifts = m_period.shiftIntVect();
        std::vector< std::pair<int,Box> > isects;

        std::set<int> my_receiver;
        for (int i = 0; i < nlocal; ++i) {
            int const ksnd = imap[i];
            Box const& vbx = ba[ksnd];
            for (auto const& shft : pshifts) {
                ba.intersections(vbx+shft, isects, false, m_ngrow);
                for (auto const& is : isects) {
                    if (is.first != ksnd || shft != 0) {
                        my_receiver.insert(is.first);
                    }
                }
            }
        }

        // Unlike normal FillBoundary, we have to build the send tags
        // differently.  This is because (b1 \ b2) \ b3 might produce
        // different BoxList than (b1 \ b3) \ b2, not just in the order of
        // Boxes in BoxList that can be fixed by sorting.  To make sure the
        // send tags on the sender process matches the recv tags on the
        // receiver process, we make the sender to use the same procedure to
        // build tags as the receiver.

        for (auto const& krcv : my_receiver) {
            tag_one_box(krcv, ba, dm, false);
        }
    }
#endif

    // No need to sort send and recv tags because they are already sorted
    // due to the way they are built.
}